

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O2

bool __thiscall
tinyusdz::primvar::PrimVar::get_interpolated_value<tinyusdz::value::matrix4f>
          (PrimVar *this,double t,TimeSampleInterpolationType tinterp,matrix4f *v)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  bool bVar8;
  pointer pSVar9;
  value_type *pvVar10;
  pointer pSVar11;
  optional<tinyusdz::value::matrix4f> pv;
  optional<tinyusdz::value::matrix4f> local_a8;
  optional<tinyusdz::value::matrix4f> local_64;
  
  if (v == (matrix4f *)0x0) {
    return false;
  }
  if (NAN(t)) {
    get_default_value<tinyusdz::value::matrix4f>(&local_a8,this);
    local_64.has_value_ = local_a8.has_value_;
    if (local_a8.has_value_ == true) goto LAB_002a890d;
    pSVar9 = (this->_ts)._samples.
             super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pSVar11 = (this->_ts)._samples.
              super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (pSVar9 == pSVar11) {
      return false;
    }
  }
  else {
    pSVar9 = (this->_ts)._samples.
             super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pSVar11 = (this->_ts)._samples.
              super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  }
  if (pSVar11 != pSVar9) {
    bVar8 = tinyusdz::value::TimeSamples::get<tinyusdz::value::matrix4f,_nullptr>
                      (&this->_ts,v,t,tinterp);
    return bVar8;
  }
  bVar8 = has_value(this);
  if (bVar8) {
    get_default_value<tinyusdz::value::matrix4f>(&local_a8,this);
    local_64.has_value_ = local_a8.has_value_;
    if (local_a8.has_value_ != false) {
LAB_002a890d:
      local_64.contained._48_8_ = local_a8.contained._48_8_;
      local_64.contained._56_8_ = local_a8.contained._56_8_;
      local_64.contained._32_8_ = local_a8.contained._32_8_;
      local_64.contained._40_8_ = local_a8.contained._40_8_;
      local_64.contained._16_8_ = local_a8.contained._16_8_;
      local_64.contained._24_8_ = local_a8.contained._24_8_;
      local_64.contained._0_8_ = local_a8.contained._0_8_;
      local_64.contained._8_8_ = local_a8.contained._8_8_;
      pvVar10 = nonstd::optional_lite::optional<tinyusdz::value::matrix4f>::value(&local_64);
      uVar1 = *(undefined8 *)(pvVar10->m[0] + 2);
      uVar2 = *(undefined8 *)pvVar10->m[1];
      uVar3 = *(undefined8 *)(pvVar10->m[1] + 2);
      uVar4 = *(undefined8 *)pvVar10->m[2];
      uVar5 = *(undefined8 *)(pvVar10->m[2] + 2);
      uVar6 = *(undefined8 *)pvVar10->m[3];
      uVar7 = *(undefined8 *)(pvVar10->m[3] + 2);
      *(undefined8 *)v->m[0] = *(undefined8 *)pvVar10->m[0];
      *(undefined8 *)(v->m[0] + 2) = uVar1;
      *(undefined8 *)v->m[1] = uVar2;
      *(undefined8 *)(v->m[1] + 2) = uVar3;
      *(undefined8 *)v->m[2] = uVar4;
      *(undefined8 *)(v->m[2] + 2) = uVar5;
      *(undefined8 *)v->m[3] = uVar6;
      *(undefined8 *)(v->m[3] + 2) = uVar7;
      return true;
    }
  }
  return false;
}

Assistant:

bool get_interpolated_value(const double t, const value::TimeSampleInterpolationType tinterp, T *v) const {
    if (!v) {
      return false;
    }

    if (value::TimeCode(t).is_default()) {

      if (auto pv = get_default_value<T>()) {
        (*v) = pv.value();
        return true;
      }

      if (_ts.empty()) {
        return false;
      }
    }

    if (has_timesamples()) {
      return _ts.get(v, t, tinterp);
    }

    if (has_default()) {
      if (auto pv = get_default_value<T>()) {
        (*v) = pv.value();
        return true;
      }
    }

    return false;
  }